

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Block *block;
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Expr *pEVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  TryExpr *this_00;
  undefined **ppuVar6;
  string *block_00;
  Location loc;
  Var var;
  CatchVector catches;
  Location local_d8;
  Var local_b0;
  vector<wabt::Catch,_std::allocator<wabt::Catch>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  GetToken((Token *)&local_b0,this);
  local_d8.field_1.field_1.offset = local_b0.loc.field_1.field_1.offset;
  local_d8.field_1._8_8_ = local_b0.loc.field_1._8_8_;
  local_d8.filename._M_len = local_b0.loc.filename._M_len;
  local_d8.filename._M_str = local_b0.loc.filename._M_str;
  TVar4 = Peek(this,0);
  if ((int)TVar4 < 0x5f) {
    if (TVar4 == Block) {
      Consume((Token *)&local_b0,this);
      this_00 = (TryExpr *)operator_new(0x118);
      *(undefined8 *)&this_00->field_0x8 = 0;
      *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
      *(undefined ***)&this_00->field_0x0 = &PTR__Expr_001e19f0;
      *(size_t *)&this_00->field_0x18 = local_d8.filename._M_len;
      *(char **)(&this_00->field_0x18 + 8) = local_d8.filename._M_str;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       (&this_00->field_0x18 + 0x10) = local_d8.field_1.field_1.offset;
      *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_d8.field_1._8_8_;
      *(undefined4 *)&this_00->field_0x38 = 8;
      ppuVar6 = &PTR__BlockExprBase_001e1d58;
      goto LAB_00162695;
    }
    if (TVar4 != If) {
LAB_00162917:
      __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xc36,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
    }
    Consume((Token *)&local_b0,this);
    this_00 = (TryExpr *)operator_new(0x150);
    *(undefined8 *)&this_00->field_0x8 = 0;
    *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
    *(undefined ***)&this_00->field_0x0 = &PTR__Expr_001e19f0;
    *(size_t *)&this_00->field_0x18 = local_d8.filename._M_len;
    *(char **)(&this_00->field_0x18 + 8) = local_d8.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     (&this_00->field_0x18 + 0x10) = local_d8.field_1.field_1.offset;
    *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_d8.field_1._8_8_;
    *(undefined4 *)&this_00->field_0x38 = 0x16;
    *(undefined ***)&this_00->field_0x0 = &PTR__IfExpr_001e2150;
    block_00 = &(this_00->block).label;
    (this_00->block).label._M_dataplus._M_p = (pointer)&(this_00->block).label.field_2;
    (this_00->block).label._M_string_length = 0;
    (this_00->block).label.field_2._M_local_buf[0] = '\0';
    (this_00->block).decl.has_func_type = false;
    Var::Var(&(this_00->block).decl.type_var);
    (this_00->block).end_loc.field_1.field_0.last_column = 0;
    (this_00->block).end_loc.filename._M_str = (char *)0x0;
    (this_00->block).end_loc.field_1.field_1.offset = 0;
    (this_00->block).exprs.size_ = 0;
    (this_00->block).end_loc.filename._M_len = 0;
    (this_00->block).exprs.first_ = (Expr *)0x0;
    (this_00->block).exprs.last_ = (Expr *)0x0;
    (this_00->block).decl.sig.result_types.
    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (this_00->block).decl.sig.result_types.
    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this_00->block).decl.sig.param_types.
    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    *(undefined8 *)
     &(this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_> = 0;
    *(undefined8 *)&(this_00->block).decl.sig.param_types = 0;
    (this_00->block).decl.sig.param_types.
    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    *(undefined8 *)&(this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
         = 0;
    (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(this_00->delegate_target).loc = 0;
    (this_00->delegate_target).loc.filename._M_str = (char *)0x0;
    (this_00->delegate_target).loc.field_1.field_1.offset = 0;
    (this_00->delegate_target).loc.field_1.field_0.last_column = 0;
    RVar5 = ParseLabelOpt(this,block_00);
    if ((RVar5.enum_ == Error) || (RVar5 = ParseBlock(this,(Block *)block_00), RVar5.enum_ == Error)
       ) goto LAB_001628d6;
    bVar3 = Match(this,Else);
    if (bVar3) {
      RVar5 = ParseEndLabelOpt(this,block_00);
      if ((RVar5.enum_ == Error) ||
         (RVar5 = ParseTerminatingInstrList(this,(ExprList *)&this_00->catches),
         RVar5.enum_ == Error)) goto LAB_001628d6;
      GetToken((Token *)&local_b0,this);
      (this_00->delegate_target).loc.field_1.field_1.offset =
           (size_t)local_b0.loc.field_1.field_1.offset;
      *(undefined8 *)((long)&(this_00->delegate_target).loc.field_1 + 8) =
           local_b0.loc.field_1._8_8_;
      *(size_t *)&(this_00->delegate_target).loc = local_b0.loc.filename._M_len;
      (this_00->delegate_target).loc.filename._M_str = local_b0.loc.filename._M_str;
    }
  }
  else {
    if (TVar4 == Loop) {
      Consume((Token *)&local_b0,this);
      this_00 = (TryExpr *)operator_new(0x118);
      *(undefined8 *)&this_00->field_0x8 = 0;
      *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
      *(undefined ***)&this_00->field_0x0 = &PTR__Expr_001e19f0;
      *(size_t *)&this_00->field_0x18 = local_d8.filename._M_len;
      *(char **)(&this_00->field_0x18 + 8) = local_d8.filename._M_str;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       (&this_00->field_0x18 + 0x10) = local_d8.field_1.field_1.offset;
      *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_d8.field_1._8_8_;
      *(undefined4 *)&this_00->field_0x38 = 0x1b;
      ppuVar6 = &PTR__BlockExprBase_001e2318;
LAB_00162695:
      *(undefined ***)&this_00->field_0x0 = ppuVar6;
      block_00 = &(this_00->block).label;
      (this_00->block).label._M_dataplus._M_p = (pointer)&(this_00->block).label.field_2;
      (this_00->block).label._M_string_length = 0;
      (this_00->block).label.field_2._M_local_buf[0] = '\0';
      (this_00->block).decl.has_func_type = false;
      Var::Var(&(this_00->block).decl.type_var);
      (this_00->block).end_loc.filename._M_str = (char *)0x0;
      (this_00->block).end_loc.field_1.field_1.offset = 0;
      (this_00->block).exprs.size_ = 0;
      (this_00->block).end_loc.filename._M_len = 0;
      (this_00->block).exprs.first_ = (Expr *)0x0;
      (this_00->block).exprs.last_ = (Expr *)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      *(undefined8 *)
       &(this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl = 0;
      *(undefined8 *)
       &(this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_> = 0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->block).end_loc.field_1.field_0.last_column = 0;
      RVar5 = ParseLabelOpt(this,block_00);
      if (RVar5.enum_ == Error) goto LAB_001628d6;
      RVar5 = ParseBlock(this,(Block *)block_00);
    }
    else {
      if (TVar4 == Try) {
        Consume((Token *)&local_b0,this);
        ErrorUnlessOpcodeEnabled(this,(Token *)&local_b0);
        this_00 = (TryExpr *)operator_new(0x178);
        TryExpr::TryExpr(this_00,&local_d8);
        local_68.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        block = &this_00->block;
        RVar5 = ParseLabelOpt(this,&block->label);
        if ((RVar5.enum_ != Error) && (RVar5 = ParseBlock(this,block), RVar5.enum_ != Error)) {
          TVar4 = Peek(this,0);
          if ((TVar4 & ~After) == Catch) {
            RVar5 = ParseCatchInstrList(this,&this_00->catches);
            if (RVar5.enum_ == Error) goto LAB_001628cc;
            this_00->kind = Catch;
          }
          else {
            TVar4 = Peek(this,0);
            if (TVar4 == Delegate) {
              Consume((Token *)&local_b0,this);
              Var::Var(&local_b0);
              RVar5 = ParseVar(this,&local_b0);
              if (RVar5.enum_ == Error) {
                Var::~Var(&local_b0);
                goto LAB_001628cc;
              }
              Var::operator=(&this_00->delegate_target,&local_b0);
              this_00->kind = Delegate;
              Var::~Var(&local_b0);
            }
          }
          paVar1 = &local_b0.loc.field_1;
          local_b0.loc.filename._M_len = (size_t)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"a valid try clause","");
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                     &local_b0,&local_b0.type_);
          bVar3 = Match(this,Lpar);
          if (bVar3) {
            RVar5 = ErrorExpected(this,&local_48,(char *)0x0);
            bVar3 = RVar5.enum_ == Error;
          }
          else {
            bVar3 = false;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b0.loc.filename._M_len != paVar1) {
            operator_delete((void *)local_b0.loc.filename._M_len,
                            (long)local_b0.loc.field_1.field_1.offset + 1);
          }
          if (!bVar3) {
            GetToken((Token *)&local_b0,this);
            (this_00->block).end_loc.field_1.field_1 = local_b0.loc.field_1.field_1.offset;
            *(undefined8 *)((long)&(this_00->block).end_loc.field_1.field_0 + 8) =
                 local_b0.loc.field_1._8_8_;
            *(size_t *)&(this_00->block).end_loc = local_b0.loc.filename._M_len;
            (this_00->block).end_loc.filename._M_str = local_b0.loc.filename._M_str;
            if (((this_00->kind == Delegate) || (RVar5 = Expect(this,End), RVar5.enum_ != Error)) &&
               (RVar5 = ParseEndLabelOpt(this,&block->label), RVar5.enum_ != Error)) {
              pEVar2 = (out_expr->_M_t).
                       super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
              (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
              if (pEVar2 != (Expr *)0x0) {
                (*pEVar2->_vptr_Expr[1])();
              }
              std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&local_68);
              return (Result)Ok;
            }
          }
        }
LAB_001628cc:
        std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&local_68);
        goto LAB_001628d6;
      }
      if (TVar4 != TryTable) goto LAB_00162917;
      Consume((Token *)&local_b0,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&local_b0);
      this_00 = (TryExpr *)operator_new(0x130);
      *(undefined8 *)&this_00->field_0x8 = 0;
      *(undefined8 *)(&this_00->field_0x8 + 8) = 0;
      *(undefined ***)&this_00->field_0x0 = &PTR__Expr_001e19f0;
      *(size_t *)&this_00->field_0x18 = local_d8.filename._M_len;
      *(char **)(&this_00->field_0x18 + 8) = local_d8.filename._M_str;
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       (&this_00->field_0x18 + 0x10) = local_d8.field_1.field_1.offset;
      *(undefined8 *)(&this_00->field_0x18 + 0x18) = local_d8.field_1._8_8_;
      *(undefined4 *)&this_00->field_0x38 = 0x3e;
      *(undefined ***)&this_00->field_0x0 = &PTR__TryTableExpr_001e2be8;
      block_00 = &(this_00->block).label;
      (this_00->block).label._M_dataplus._M_p = (pointer)&(this_00->block).label.field_2;
      (this_00->block).label._M_string_length = 0;
      (this_00->block).label.field_2._M_local_buf[0] = '\0';
      (this_00->block).decl.has_func_type = false;
      Var::Var(&(this_00->block).decl.type_var);
      (this_00->block).end_loc.filename._M_str = (char *)0x0;
      (this_00->block).end_loc.field_1.field_1.offset = 0;
      (this_00->block).exprs.size_ = 0;
      (this_00->block).end_loc.filename._M_len = 0;
      (this_00->block).exprs.first_ = (Expr *)0x0;
      (this_00->block).exprs.last_ = (Expr *)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->block).decl.sig.result_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      *(undefined8 *)
       &(this_00->block).decl.sig.result_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl = 0;
      *(undefined8 *)
       &(this_00->block).decl.sig.param_types.
        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_> = 0;
      (this_00->block).decl.sig.param_types.
      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->block).end_loc.field_1.field_0.last_column = 0;
      *(undefined8 *)
       &(this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl = 0
      ;
      (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RVar5 = ParseLabelOpt(this,block_00);
      if (((RVar5.enum_ == Error) ||
          (RVar5 = ParseBlockDeclaration(this,&(this_00->block).decl), RVar5.enum_ == Error)) ||
         (RVar5 = ParseTryTableCatches(this,(TryTableVector *)&this_00->catches),
         RVar5.enum_ == Error)) goto LAB_001628d6;
      RVar5 = ParseInstrList(this,&(this_00->block).exprs);
    }
    if (RVar5.enum_ == Error) goto LAB_001628d6;
  }
  RVar5 = Expect(this,End);
  if ((RVar5.enum_ != Error) && (RVar5 = ParseEndLabelOpt(this,block_00), RVar5.enum_ != Error)) {
    pEVar2 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    if (pEVar2 == (Expr *)0x0) {
      return (Result)Ok;
    }
    (*pEVar2->_vptr_Expr[1])();
    return (Result)Ok;
  }
LAB_001628d6:
  (**(code **)(*(long *)&this_00->field_0x0 + 8))(this_00);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = std::make_unique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = std::make_unique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = std::make_unique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryExpr>(loc);
      CatchVector catches;
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      if (IsCatch(Peek())) {
        CHECK_RESULT(ParseCatchInstrList(&expr->catches));
        expr->kind = TryKind::Catch;
      } else if (PeekMatch(TokenType::Delegate)) {
        Consume();
        Var var;
        CHECK_RESULT(ParseVar(&var));
        expr->delegate_target = var;
        expr->kind = TryKind::Delegate;
      }
      CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
      expr->block.end_loc = GetLocation();
      if (expr->kind != TryKind::Delegate) {
        EXPECT(End);
      }
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::TryTable: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryTableExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
      CHECK_RESULT(ParseTryTableCatches(&expr->catches));
      CHECK_RESULT(ParseInstrList(&expr->block.exprs));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}